

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void __thiscall DThinker::ChangeStatNum(DThinker *this,int statnum)

{
  bool bVar1;
  FThinkerList *local_20;
  FThinkerList *list;
  int statnum_local;
  DThinker *this_local;
  
  bVar1 = false;
  if (this->NextThinker != (DThinker *)0x0) {
    bVar1 = this->PrevThinker != (DThinker *)0x0;
  }
  if (!bVar1) {
    __assert_fail("NextThinker != NULL && PrevThinker != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                  ,0x173,"void DThinker::ChangeStatNum(int)");
  }
  list._4_4_ = statnum;
  if (0x7f < (uint)statnum) {
    list._4_4_ = 0x7f;
  }
  Remove(this);
  if ((((this->super_DObject).ObjectFlags & 0x100) == 0) || (list._4_4_ < 0x20)) {
    local_20 = Thinkers + list._4_4_;
  }
  else {
    local_20 = FreshThinkers + list._4_4_;
  }
  FThinkerList::AddTail(local_20,this);
  return;
}

Assistant:

void DThinker::ChangeStatNum (int statnum)
{
	FThinkerList *list;

	// This thinker should already be in a list; verify that.
	assert(NextThinker != NULL && PrevThinker != NULL);

	if ((unsigned)statnum > MAX_STATNUM)
	{
		statnum = MAX_STATNUM;
	}
	Remove();
	if ((ObjectFlags & OF_JustSpawned) && statnum >= STAT_FIRST_THINKING)
	{
		list = &FreshThinkers[statnum];
	}
	else
	{
		list = &Thinkers[statnum];
	}
	list->AddTail(this);
}